

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

LPCWSTR __thiscall
Js::DeferDeserializeFunctionInfo::GetSourceInfo
          (DeferDeserializeFunctionInfo *this,int *lineNumber,int *columnNumber)

{
  ULONG UVar1;
  LPCWSTR pWVar2;
  SourceContextInfo *local_38;
  bool local_2a;
  bool local_29;
  ULONG local_28;
  bool m_isDynamicFunction;
  ULONG UStack_24;
  bool m_isEval;
  int columnNumberField;
  int lineNumberField;
  int *columnNumber_local;
  int *lineNumber_local;
  DeferDeserializeFunctionInfo *this_local;
  
  _columnNumberField = (ULONG *)columnNumber;
  columnNumber_local = lineNumber;
  lineNumber_local = (int *)this;
  ByteCodeSerializer::ReadSourceInfo
            (this,(int *)&stack0xffffffffffffffdc,(int *)&local_28,&local_29,&local_2a);
  UVar1 = FunctionProxy::ComputeAbsoluteLineNumber(&this->super_FunctionProxy,UStack_24);
  *columnNumber_local = UVar1;
  UVar1 = FunctionProxy::ComputeAbsoluteColumnNumber(&this->super_FunctionProxy,UStack_24,local_28);
  *_columnNumberField = UVar1;
  local_38 = FunctionProxy::GetSourceContextInfo(&this->super_FunctionProxy);
  pWVar2 = ParseableFunctionInfo::GetSourceName<SourceContextInfo*>
                     (&local_38,(bool)(local_29 & 1),(bool)(local_2a & 1));
  return pWVar2;
}

Assistant:

LPCWSTR DeferDeserializeFunctionInfo::GetSourceInfo(int& lineNumber, int& columnNumber) const
    {
        // Read all the necessary information from the serialized byte code
        int lineNumberField, columnNumberField;
        bool m_isEval, m_isDynamicFunction;
        ByteCodeSerializer::ReadSourceInfo(this, lineNumberField, columnNumberField, m_isEval, m_isDynamicFunction);

        // Decode them
        lineNumber = ComputeAbsoluteLineNumber(lineNumberField);
        columnNumber = ComputeAbsoluteColumnNumber(lineNumberField, columnNumberField);
        return Js::ParseableFunctionInfo::GetSourceName<SourceContextInfo*>(this->GetSourceContextInfo(), m_isEval, m_isDynamicFunction);
    }